

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringGet(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  StringWTF16Get *pSVar2;
  Type local_40;
  Expression *local_38;
  Expression *pos;
  Expression *local_28;
  Expression *ref;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ref._4_4_ = 2;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ref + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xeb1,"Expression *wasm::TranslateToFuzzReader::makeStringGet(Type)");
  }
  HeapType::HeapType((HeapType *)&pos,string);
  local_28 = makeTrappingRefUse(this,(HeapType)pos);
  Type::Type(&local_40,i32);
  local_38 = make(this,local_40);
  pSVar2 = Builder::makeStringWTF16Get(&this->builder,local_28,local_38);
  return (Expression *)pSVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringGet(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* pos = make(Type::i32);
  return builder.makeStringWTF16Get(ref, pos);
}